

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::AddExtInstImport(IRContext *this,string *name)

{
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  Instruction *this_00;
  Operand *local_c8;
  allocator<spvtools::opt::Operand> local_b9;
  SmallVector<unsigned_int,_2UL> local_b8;
  Operand local_90;
  iterator local_60;
  _func_int **local_58;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_50;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_38;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> ext_words;
  string *name_local;
  IRContext *this_local;
  
  ext_words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,name);
  this_00 = (Instruction *)::operator_new(0x70);
  res_id = TakeNextId(this);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            (&local_b8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  Operand::Operand(&local_90,SPV_OPERAND_TYPE_LITERAL_STRING,&local_b8);
  local_60 = &local_90;
  local_58 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_b9);
  __l._M_len = (size_type)local_58;
  __l._M_array = local_60;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_50,__l,&local_b9);
  opt::Instruction::Instruction(this_00,this,OpExtInstImport,0,res_id,&local_50);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_38,this_00);
  AddExtInstImport(this,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_38);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_50);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_b9);
  local_c8 = (Operand *)&local_60;
  do {
    local_c8 = local_c8 + -1;
    Operand::~Operand(local_c8);
  } while (local_c8 != &local_90);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return;
}

Assistant:

void IRContext::AddExtInstImport(const std::string& name) {
  std::vector<uint32_t> ext_words = spvtools::utils::MakeVector(name);
  AddExtInstImport(std::unique_ptr<Instruction>(
      new Instruction(this, spv::Op::OpExtInstImport, 0u, TakeNextId(),
                      {{SPV_OPERAND_TYPE_LITERAL_STRING, ext_words}})));
}